

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O3

vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_> *
benchmark::ComputeStats
          (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           *__return_storage_ptr__,
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          *reports)

{
  pointer pcVar1;
  size_t sVar2;
  long lVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  int iVar6;
  long lVar7;
  pointer pRVar8;
  pointer pRVar9;
  pointer pRVar10;
  size_type *psVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar22;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Run stddev_data;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  _Alloc_hider local_180;
  char *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  bool local_160;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  int64_t local_138;
  TimeUnit local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [12];
  undefined4 uStack_10c;
  undefined1 auStack_108 [12];
  int local_f0;
  undefined2 local_ec;
  undefined1 local_e8 [32];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  bool local_a8;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  int64_t local_80;
  TimeUnit local_78;
  undefined1 local_70 [16];
  double local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined1 auStack_50 [12];
  int local_38;
  undefined2 local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar10 = (reports->
            super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pRVar9 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar10 == pRVar9) {
    if ((ulong)(((long)pRVar9 - (long)pRVar10 >> 3) * -0x2c8590b21642c859) < 2) {
      return __return_storage_ptr__;
    }
    lVar7 = pRVar10->iterations;
  }
  else {
    lVar7 = 0;
    pRVar8 = pRVar10;
    do {
      lVar7 = lVar7 + (ulong)pRVar8->error_occurred;
      pRVar8 = pRVar8 + 1;
    } while (pRVar8 != pRVar9);
    if ((ulong)(((long)pRVar9 - (long)pRVar10 >> 3) * -0x2c8590b21642c859 - lVar7) < 2) {
      return __return_storage_ptr__;
    }
    lVar7 = pRVar10->iterations;
    if (pRVar10 != pRVar9) {
      local_238 = (undefined1  [16])0x0;
      local_248 = (undefined1  [16])0x0;
      local_1f8 = (undefined1  [16])0x0;
      local_228 = (undefined1  [16])0x0;
      local_208 = (undefined1  [16])0x0;
      local_218 = (undefined1  [16])0x0;
      do {
        pRVar8 = (reports->
                 super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        sVar2 = (pRVar8->benchmark_name)._M_string_length;
        if ((sVar2 != (pRVar10->benchmark_name)._M_string_length) ||
           ((sVar2 != 0 &&
            (iVar6 = bcmp((pRVar8->benchmark_name)._M_dataplus._M_p,
                          (pRVar10->benchmark_name)._M_dataplus._M_p,sVar2), iVar6 != 0)))) {
          internal::CheckHandler::CheckHandler
                    ((CheckHandler *)local_1a0,"(reports[0].benchmark_name) == (run.benchmark_name)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/complexity.cc"
                     ,"ComputeStats",0xb2);
          internal::CheckHandler::~CheckHandler((CheckHandler *)local_1a0);
        }
        internal::GetNullLogInstance();
        if (lVar7 != pRVar10->iterations) {
          internal::CheckHandler::CheckHandler
                    ((CheckHandler *)local_1a0,"(run_iterations) == (run.iterations)",
                     "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/complexity.cc"
                     ,"ComputeStats",0xb3);
          internal::CheckHandler::~CheckHandler((CheckHandler *)local_1a0);
        }
        internal::GetNullLogInstance();
        if (pRVar10->error_occurred == false) {
          lVar3 = pRVar10->iterations;
          auVar30._0_8_ = (double)lVar3;
          auVar15._0_8_ = pRVar10->real_accumulated_time;
          auVar15._8_8_ = pRVar10->cpu_accumulated_time;
          auVar30._8_8_ = auVar30._0_8_;
          auVar15 = divpd(auVar15,auVar30);
          dVar14 = auVar15._0_8_;
          dVar22 = auVar15._8_8_;
          local_248._8_8_ = (double)local_248._8_8_ + dVar22 * auVar30._0_8_;
          local_248._0_8_ = (double)local_248._0_8_ + dVar14 * auVar30._0_8_;
          auVar31._8_4_ = (int)lVar3;
          auVar31._0_8_ = lVar3;
          auVar31._12_4_ = (int)((ulong)lVar3 >> 0x20);
          local_238._8_8_ = local_238._8_8_ + auVar31._8_8_;
          local_238._0_8_ = local_238._0_8_ + lVar3;
          dVar28 = pRVar10->bytes_per_second;
          dVar29 = pRVar10->items_per_second;
          local_228._8_8_ = (double)local_228._8_8_ + dVar29 * auVar30._0_8_;
          local_228._0_8_ = (double)local_228._0_8_ + dVar28 * auVar30._0_8_;
          local_208._8_8_ = (double)local_208._8_8_ + dVar29 * dVar29 * auVar30._0_8_;
          local_208._0_8_ = (double)local_208._0_8_ + dVar28 * dVar28 * auVar30._0_8_;
          local_218._8_8_ = (double)local_218._8_8_ + dVar22 * dVar22 * auVar30._0_8_;
          local_218._0_8_ = (double)local_218._0_8_ + dVar14 * dVar14 * auVar30._0_8_;
          local_1f8._8_8_ = local_1f8._8_8_ + auVar31._8_8_;
          local_1f8._0_8_ = local_1f8._0_8_ + lVar3;
        }
        pRVar10 = pRVar10 + 1;
      } while (pRVar10 != pRVar9);
      pRVar10 = (reports->
                super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                )._M_impl.super__Vector_impl_data._M_start;
      goto LAB_00124aa9;
    }
  }
  local_238 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
LAB_00124aa9:
  local_1a0._0_8_ = local_1a0 + 0x10;
  local_1a0._8_8_ = 0;
  local_1a0[0x10] = '\0';
  local_180._M_p = (pointer)&local_170;
  local_178 = (char *)0x0;
  local_170._M_local_buf[0] = '\0';
  local_160 = false;
  local_158._M_p = (pointer)&local_148;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138 = 1;
  local_130 = kNanosecond;
  local_f0 = 0;
  local_ec._0_1_ = false;
  local_ec._1_1_ = false;
  local_128 = (undefined1  [16])0x0;
  local_118 = SUB1612((undefined1  [16])0x0,0);
  uStack_10c = 0;
  auStack_108 = SUB1612((undefined1  [16])0x0,4);
  pcVar1 = local_e8 + 0x10;
  pcVar4 = (pRVar10->benchmark_name)._M_dataplus._M_p;
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar4,pcVar4 + (pRVar10->benchmark_name)._M_string_length);
  std::__cxx11::string::append(local_e8);
  std::__cxx11::string::operator=((string *)local_1a0,(string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_);
  }
  auVar16._0_8_ = (double)local_238._0_8_;
  auVar16._8_8_ = (double)local_238._8_8_;
  auVar31 = divpd(_DAT_00135600,auVar16);
  dVar28 = (double)local_248._0_8_ * auVar31._0_8_;
  dVar29 = (double)local_248._8_8_ * auVar31._8_8_;
  auVar17._0_4_ = -(uint)(local_238._0_4_ == 0);
  auVar17._4_4_ = -(uint)(local_238._4_4_ == 0);
  auVar17._8_4_ = -(uint)(local_238._8_4_ == 0);
  auVar17._12_4_ = -(uint)(local_238._12_4_ == 0);
  auVar24._4_4_ = auVar17._0_4_;
  auVar24._0_4_ = auVar17._4_4_;
  auVar24._8_4_ = auVar17._12_4_;
  auVar24._12_4_ = auVar17._8_4_;
  auVar25._8_8_ = dVar29;
  auVar25._0_8_ = dVar28;
  auVar25 = ~(auVar24 & auVar17) & auVar25;
  local_128._8_8_ = (double)lVar7 * auVar25._8_8_;
  local_128._0_8_ = (double)lVar7 * auVar25._0_8_;
  auVar18._0_8_ = (double)local_1f8._0_8_;
  auVar18._8_8_ = (double)local_1f8._8_8_;
  auVar30 = divpd(_DAT_00135600,auVar18);
  auVar23._0_8_ = (double)local_228._0_8_ * auVar30._0_8_;
  auVar23._8_8_ = (double)local_228._8_8_ * auVar30._8_8_;
  auVar13._0_4_ = -(uint)(local_1f8._0_4_ == 0);
  auVar13._4_4_ = -(uint)(local_1f8._4_4_ == 0);
  auVar13._8_4_ = -(uint)(local_1f8._8_4_ == 0);
  auVar13._12_4_ = -(uint)(local_1f8._12_4_ == 0);
  auVar19._4_4_ = auVar13._0_4_;
  auVar19._0_4_ = auVar13._4_4_;
  auVar19._8_4_ = auVar13._12_4_;
  auVar19._12_4_ = auVar13._8_4_;
  auVar15 = ~(auVar19 & auVar13) & auVar23;
  local_118 = auVar15._0_12_;
  uStack_10c = auVar15._12_4_;
  local_138 = lVar7;
  std::__cxx11::string::_M_assign((string *)&local_180);
  pRVar9 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((long)(reports->
                  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3) *
           -0x2c8590b21642c859;
  if (1 < uVar12) {
    sVar2 = (pRVar9->report_label)._M_string_length;
    lVar7 = uVar12 - 1;
    psVar11 = &pRVar9[1].report_label._M_string_length;
    do {
      if ((*psVar11 != sVar2) ||
         ((sVar2 != 0 &&
          (iVar6 = bcmp((((string *)(psVar11 + -1))->_M_dataplus)._M_p,
                        (pRVar9->report_label)._M_dataplus._M_p,sVar2), iVar6 != 0)))) {
        std::__cxx11::string::_M_replace((ulong)&local_180,0,local_178,0x134ed4);
        pRVar9 = (reports->
                 super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        break;
      }
      psVar11 = psVar11 + 0x17;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  local_e8._8_8_ = 0;
  local_e8[0x10] = '\0';
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8 = false;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 1;
  local_78 = kNanosecond;
  local_38 = 0;
  local_34._0_1_ = false;
  local_34._1_1_ = false;
  local_70 = (undefined1  [16])0x0;
  local_60 = 0.0;
  uStack_58 = 0;
  uStack_54 = 0;
  auStack_50 = SUB1612((undefined1  [16])0x0,4);
  _Var5._M_p = (pRVar9->benchmark_name)._M_dataplus._M_p;
  local_1c0[0] = local_1b0;
  local_e8._0_8_ = pcVar1;
  local_c8._M_p = (pointer)&local_b8;
  local_a0._M_p = (pointer)&local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,_Var5._M_p,_Var5._M_p + (pRVar9->benchmark_name)._M_string_length);
  std::__cxx11::string::append((char *)local_1c0);
  std::__cxx11::string::operator=((string *)local_e8,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  std::__cxx11::string::_M_assign((string *)&local_c8);
  auVar20._0_4_ = -(uint)(local_238._0_4_ == 0);
  auVar20._4_4_ = -(uint)(local_238._4_4_ == 0);
  auVar20._8_4_ = -(uint)(local_238._8_4_ == 0);
  auVar20._12_4_ = -(uint)(local_238._12_4_ == 0);
  auVar26._4_4_ = auVar20._0_4_;
  auVar26._0_4_ = auVar20._4_4_;
  auVar26._8_4_ = auVar20._12_4_;
  auVar26._12_4_ = auVar20._8_4_;
  local_80 = 0;
  dVar14 = 0.0;
  if ((auVar26 & auVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    dVar28 = (double)local_218._0_8_ * auVar31._0_8_ - dVar28 * dVar28;
    dVar14 = 0.0;
    if (0.0 <= dVar28) {
      if (dVar28 < 0.0) {
        dVar14 = sqrt(dVar28);
      }
      else {
        dVar14 = SQRT(dVar28);
      }
    }
  }
  dVar28 = 0.0;
  local_70._0_8_ = dVar14;
  if ((auVar26 & auVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    dVar29 = (double)local_218._8_8_ * auVar31._8_8_ - dVar29 * dVar29;
    if (0.0 <= dVar29) {
      if (dVar29 < 0.0) {
        dVar28 = sqrt(dVar29);
        dVar14 = (double)local_70._0_8_;
      }
      else {
        dVar28 = SQRT(dVar29);
      }
    }
  }
  local_70._0_8_ = dVar14;
  auVar21._0_4_ = -(uint)(local_1f8._0_4_ == 0);
  auVar21._4_4_ = -(uint)(local_1f8._4_4_ == 0);
  auVar21._8_4_ = -(uint)(local_1f8._8_4_ == 0);
  auVar21._12_4_ = -(uint)(local_1f8._12_4_ == 0);
  auVar27._4_4_ = auVar21._0_4_;
  auVar27._0_4_ = auVar21._4_4_;
  auVar27._8_4_ = auVar21._12_4_;
  auVar27._12_4_ = auVar21._8_4_;
  local_70._8_8_ = dVar28;
  dVar28 = 0.0;
  if ((auVar27 & auVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    dVar29 = (double)local_208._0_8_ * auVar30._0_8_ - auVar23._0_8_ * auVar23._0_8_;
    dVar28 = 0.0;
    if (0.0 <= dVar29) {
      if (dVar29 < 0.0) {
        dVar28 = sqrt(dVar29);
      }
      else {
        dVar28 = SQRT(dVar29);
      }
    }
  }
  dVar29 = 0.0;
  local_60 = dVar28;
  if ((auVar27 & auVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    dVar28 = (double)local_208._8_8_ * auVar30._8_8_ - auVar23._8_8_ * auVar23._8_8_;
    if (0.0 <= dVar28) {
      if (dVar28 < 0.0) {
        dVar29 = sqrt(dVar28);
      }
      else {
        dVar29 = SQRT(dVar28);
      }
    }
  }
  uStack_58 = SUB84(dVar29,0);
  uStack_54 = (undefined4)((ulong)dVar29 >> 0x20);
  std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_1a0);
  std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p);
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != &local_148) {
    operator_delete(local_158._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p);
  }
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BenchmarkReporter::Run> ComputeStats(
    const std::vector<BenchmarkReporter::Run>& reports) {
  typedef BenchmarkReporter::Run Run;
  std::vector<Run> results;

  auto error_count =
      std::count_if(reports.begin(), reports.end(),
                    [](Run const& run) { return run.error_occurred; });

  if (reports.size() - error_count < 2) {
    // We don't report aggregated data if there was a single run.
    return results;
  }
  // Accumulators.
  Stat1_d real_accumulated_time_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d items_per_second_stat;
  // All repetitions should be run with the same number of iterations so we
  // can take this information from the first benchmark.
  int64_t const run_iterations = reports.front().iterations;

  // Populate the accumulators.
  for (Run const& run : reports) {
    CHECK_EQ(reports[0].benchmark_name, run.benchmark_name);
    CHECK_EQ(run_iterations, run.iterations);
    if (run.error_occurred) continue;
    real_accumulated_time_stat +=
        Stat1_d(run.real_accumulated_time / run.iterations, run.iterations);
    cpu_accumulated_time_stat +=
        Stat1_d(run.cpu_accumulated_time / run.iterations, run.iterations);
    items_per_second_stat += Stat1_d(run.items_per_second, run.iterations);
    bytes_per_second_stat += Stat1_d(run.bytes_per_second, run.iterations);
  }

  // Get the data from the accumulator to BenchmarkReporter::Run's.
  Run mean_data;
  mean_data.benchmark_name = reports[0].benchmark_name + "_mean";
  mean_data.iterations = run_iterations;
  mean_data.real_accumulated_time =
      real_accumulated_time_stat.Mean() * run_iterations;
  mean_data.cpu_accumulated_time =
      cpu_accumulated_time_stat.Mean() * run_iterations;
  mean_data.bytes_per_second = bytes_per_second_stat.Mean();
  mean_data.items_per_second = items_per_second_stat.Mean();

  // Only add label to mean/stddev if it is same for all runs
  mean_data.report_label = reports[0].report_label;
  for (std::size_t i = 1; i < reports.size(); i++) {
    if (reports[i].report_label != reports[0].report_label) {
      mean_data.report_label = "";
      break;
    }
  }

  Run stddev_data;
  stddev_data.benchmark_name = reports[0].benchmark_name + "_stddev";
  stddev_data.report_label = mean_data.report_label;
  stddev_data.iterations = 0;
  stddev_data.real_accumulated_time = real_accumulated_time_stat.StdDev();
  stddev_data.cpu_accumulated_time = cpu_accumulated_time_stat.StdDev();
  stddev_data.bytes_per_second = bytes_per_second_stat.StdDev();
  stddev_data.items_per_second = items_per_second_stat.StdDev();

  results.push_back(mean_data);
  results.push_back(stddev_data);
  return results;
}